

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

void __thiscall
apngasm::APNGAsm::compose_frame
          (APNGAsm *this,uchar **rows_dst,uchar **rows_src,uchar bop,uint x,uint y,uint w,uint h)

{
  uchar *__src;
  int iVar1;
  ulong uVar2;
  uchar *__dest;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  if (h != 0) {
    uVar2 = 0;
    do {
      __dest = rows_dst[y + (int)uVar2] + (x << 2);
      __src = rows_src[uVar2];
      if (bop == '\0') {
        memcpy(__dest,__src,(ulong)(w * 4));
      }
      else if (w != 0) {
        lVar5 = 0;
        do {
          if (__src[lVar5 * 4 + 3] != 0) {
            uVar3 = (uint)__src[lVar5 * 4 + 3];
            if ((uVar3 == 0xff) || (__dest[lVar5 * 4 + 3] == 0)) {
              *(undefined4 *)(__dest + lVar5 * 4) = *(undefined4 *)(__src + lVar5 * 4);
            }
            else {
              iVar1 = uVar3 * 0xff;
              iVar4 = (uVar3 ^ 0xff) * (uint)__dest[lVar5 * 4 + 3];
              uVar3 = iVar4 + iVar1;
              __dest[lVar5 * 4] =
                   (uchar)(((uint)__dest[lVar5 * 4] * iVar4 + (uint)__src[lVar5 * 4] * iVar1) /
                          uVar3);
              __dest[lVar5 * 4 + 1] =
                   (uchar)(((uint)__dest[lVar5 * 4 + 1] * iVar4 + (uint)__src[lVar5 * 4 + 1] * iVar1
                           ) / uVar3);
              __dest[lVar5 * 4 + 2] =
                   (uchar)(((uint)__dest[lVar5 * 4 + 2] * iVar4 + (uint)__src[lVar5 * 4 + 2] * iVar1
                           ) / uVar3);
              __dest[lVar5 * 4 + 3] = (uchar)((ulong)uVar3 * 0x1010102 >> 0x20);
            }
          }
          lVar5 = lVar5 + 1;
        } while (w != (uint)lVar5);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != h);
  }
  return;
}

Assistant:

void APNGAsm::compose_frame(unsigned char ** rows_dst, unsigned char ** rows_src, unsigned char bop, unsigned int x, unsigned int y, unsigned int w, unsigned int h)
  {
    unsigned int  i, j;
    int u, v, al;

    for (j=0; j<h; j++)
    {
      unsigned char * sp = rows_src[j];
      unsigned char * dp = rows_dst[j+y] + x*4;

      if (bop == 0)
        memcpy(dp, sp, w*4);
      else
      for (i=0; i<w; i++, sp+=4, dp+=4)
      {
        if (sp[3] == 255)
          memcpy(dp, sp, 4);
        else
        if (sp[3] != 0)
        {
          if (dp[3] != 0)
          {
            u = sp[3]*255;
            v = (255-sp[3])*dp[3];
            al = u + v;
            dp[0] = (sp[0]*u + dp[0]*v)/al;
            dp[1] = (sp[1]*u + dp[1]*v)/al;
            dp[2] = (sp[2]*u + dp[2]*v)/al;
            dp[3] = al/255;
          }
          else
            memcpy(dp, sp, 4);
        }
      }
    }
  }